

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

string * __thiscall
program_options::error_with_option_name::get_canonical_option_prefix_abi_cxx11_
          (string *__return_storage_ptr__,error_with_option_name *this)

{
  logic_error *this_00;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch(this->m_option_style) {
  case 0:
    __s = "";
    __a = &local_15;
    break;
  case 1:
    __s = "--";
    __a = &local_14;
    break;
  case 2:
  case 3:
  case 5:
  case 6:
  case 7:
switchD_001590f2_caseD_2:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "error_with_option_name::m_option_style can only be one of [0, allow_dash_for_short, allow_slash_for_short, allow_long_disguise or allow_long]"
              );
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case 4:
    __s = "-";
    __a = &local_11;
    break;
  case 8:
    __s = "/";
    __a = &local_12;
    break;
  default:
    if (this->m_option_style != 0x1000) goto switchD_001590f2_caseD_2;
    __s = "-";
    __a = &local_13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string error_with_option_name::get_canonical_option_prefix() const
{
    switch (m_option_style)
    {
    case command_line_style::allow_dash_for_short:
        return "-";
    case command_line_style::allow_slash_for_short:
        return "/";
    case command_line_style::allow_long_disguise:
        return "-";
    case command_line_style::allow_long:
        return "--";
    case 0:
        return "";
    }
    throw std::logic_error("error_with_option_name::m_option_style can only be "
                           "one of [0, allow_dash_for_short, allow_slash_for_short, "
                           "allow_long_disguise or allow_long]");
}